

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateSequence(ExpressionEvalContext *ctx,ExprSequence *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  int iVar5;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  undefined4 extraout_var_00;
  ulong uVar7;
  bool bVar8;
  
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar6->typeID = 2;
    pEVar6->source = pSVar3;
    pEVar6->type = pTVar4;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229698;
    bVar8 = (expression->expressions).count != 0;
    if (bVar8) {
      pEVar6 = Evaluate(ctx,*(expression->expressions).data);
      if (pEVar6 != (ExprBase *)0x0) {
        uVar7 = 1;
        do {
          bVar8 = uVar7 < (expression->expressions).count;
          if (!bVar8) goto LAB_0013f96a;
          pEVar6 = Evaluate(ctx,(expression->expressions).data[uVar7]);
          uVar7 = uVar7 + 1;
        } while (pEVar6 != (ExprBase *)0x0);
      }
      pEVar6 = (ExprBase *)0x0;
    }
LAB_0013f96a:
    if (!bVar8) {
      uVar1 = (ctx->stackFrames).count;
      if ((uVar1 != 0) && ((ctx->stackFrames).data[uVar1 - 1]->targetYield != 0)) {
        pAVar2 = ctx->ctx->allocator;
        iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var_00,iVar5);
        pSVar3 = (expression->super_ExprBase).source;
        pTVar4 = ctx->ctx->typeVoid;
        pEVar6->typeID = 2;
        pEVar6->source = pSVar3;
        pEVar6->type = pTVar4;
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229698;
        return pEVar6;
      }
      pEVar6 = CheckType(&expression->super_ExprBase,pEVar6);
      return pEVar6;
    }
  }
  else {
    Report(ctx,"ERROR: instruction limit reached");
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateSequence(ExpressionEvalContext &ctx, ExprSequence *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *result = new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	for(unsigned i = 0; i < expression->expressions.size(); i++)
	{
		result = Evaluate(ctx, expression->expressions[i]);

		if(!result)
			return NULL;
	}

	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	return CheckType(expression, result);
}